

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

bool common::ReadSettings
               (path *path,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *values,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *errors)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  bool bVar1;
  byte bVar2;
  ssize_t sVar3;
  size_type sVar4;
  const_reference args_1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  fmt;
  const_reference this;
  undefined1 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_FS_OFFSET;
  __sv_type _Var6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_bool>
  pVar7;
  size_t i;
  vector<UniValue,_std::allocator<UniValue>_> *in_values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_keys;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_bool>
  inserted;
  SettingsValue in;
  ifstream file;
  undefined4 in_stack_fffffffffffffac8;
  openmode in_stack_fffffffffffffacc;
  UniValue *in_stack_fffffffffffffad0;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf0;
  UniValue *in_stack_fffffffffffffaf8;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  char *in_stack_fffffffffffffb08;
  streambuf_type *in_stack_fffffffffffffb10;
  ulong uVar8;
  undefined8 in_stack_fffffffffffffb18;
  streambuf_type *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  ulong local_488;
  char *local_468;
  bool local_431;
  allocator<char> local_419;
  _Base_ptr local_418;
  undefined1 local_410;
  size_t local_408;
  UniValue local_388 [2];
  UniValue local_2a8;
  undefined1 local_210 [520];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  bVar1 = fs::exists((path *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  if (bVar1) {
    std::ifstream::ifstream(local_210);
    std::basic_ifstream<char,_std::char_traits<char>_>::open<fs::path>
              ((basic_ifstream<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               (path *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffad0);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      local_431 = false;
    }
    else {
      UniValue::UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffffae8,
                 (istream_type *)in_stack_fffffffffffffae0);
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      std::allocator<char>::allocator();
      __beg._8_8_ = in_stack_fffffffffffffb28;
      __beg._M_sbuf = in_stack_fffffffffffffb20;
      __end._8_8_ = in_stack_fffffffffffffb18;
      __end._M_sbuf = in_stack_fffffffffffffb10;
      std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffae8,__beg,__end,(allocator<char> *)in_stack_fffffffffffffae0)
      ;
      _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffae8);
      local_468 = _Var6._M_str;
      sVar3 = UniValue::read(&local_2a8,(int)_Var6._M_len,local_468,local_408);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      std::allocator<char>::~allocator(&local_419);
      if ((((byte)sVar3 ^ 0xff) & 1) == 0) {
        bVar2 = std::ios::fail();
        if ((bVar2 & 1) == 0) {
          std::ifstream::close();
          bVar1 = UniValue::isObject((UniValue *)
                                     CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
          if (bVar1) {
            UniValue::getKeys_abi_cxx11_(in_stack_fffffffffffffad0);
            UniValue::getValues(in_stack_fffffffffffffaf8);
            local_488 = 0;
            while( true ) {
              uVar8 = local_488;
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
              if (sVar4 <= uVar8) break;
              args_1 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8)
                                    ,(size_type)in_stack_fffffffffffffad0);
              std::vector<UniValue,_std::allocator<UniValue>_>::operator[]
                        ((vector<UniValue,_std::allocator<UniValue>_> *)
                         CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                         (size_type)in_stack_fffffffffffffad0);
              pVar7 = std::
                      map<std::__cxx11::string,UniValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>
                      ::emplace<std::__cxx11::string_const&,UniValue_const&>
                                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                  *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                                 (UniValue *)
                                 CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
              fmt = pVar7.first._M_node;
              uVar5 = pVar7.second;
              local_418 = fmt._M_node;
              local_410 = uVar5;
              if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                this = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8)
                                    ,(size_type)in_stack_fffffffffffffad0);
                fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffad0);
                tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                          ((char *)fmt._M_node,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar5,in_stack_fffffffffffffb00),args_1);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this,in_RDX);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                         *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
                break;
              }
              local_488 = local_488 + 1;
            }
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                     *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                    (key_type *)in_stack_fffffffffffffad0);
            local_431 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
          }
          else {
            UniValue::write_abi_cxx11_(local_388,(int)&local_2a8,(void *)0x0,0);
            fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffad0);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (in_stack_fffffffffffffb08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffaf8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
            local_431 = false;
          }
        }
        else {
          fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffad0);
          tinyformat::format<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
          local_431 = false;
        }
      }
      else {
        fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffad0);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
        local_431 = false;
      }
      UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8))
      ;
    }
    std::ifstream::~ifstream(local_210);
  }
  else {
    local_431 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_431;
  }
  __stack_chk_fail();
}

Assistant:

bool ReadSettings(const fs::path& path, std::map<std::string, SettingsValue>& values, std::vector<std::string>& errors)
{
    values.clear();
    errors.clear();

    // Ok for file to not exist
    if (!fs::exists(path)) return true;

    std::ifstream file;
    file.open(path);
    if (!file.is_open()) {
      errors.emplace_back(strprintf("%s. Please check permissions.", fs::PathToString(path)));
      return false;
    }

    SettingsValue in;
    if (!in.read(std::string{std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>()})) {
        errors.emplace_back(strprintf("Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, "
                                      "and can be fixed by removing the file, which will reset settings to default values.",
                                      fs::PathToString(path)));
        return false;
    }

    if (file.fail()) {
        errors.emplace_back(strprintf("Failed reading settings file %s", fs::PathToString(path)));
        return false;
    }
    file.close(); // Done with file descriptor. Release while copying data.

    if (!in.isObject()) {
        errors.emplace_back(strprintf("Found non-object value %s in settings file %s", in.write(), fs::PathToString(path)));
        return false;
    }

    const std::vector<std::string>& in_keys = in.getKeys();
    const std::vector<SettingsValue>& in_values = in.getValues();
    for (size_t i = 0; i < in_keys.size(); ++i) {
        auto inserted = values.emplace(in_keys[i], in_values[i]);
        if (!inserted.second) {
            errors.emplace_back(strprintf("Found duplicate key %s in settings file %s", in_keys[i], fs::PathToString(path)));
            values.clear();
            break;
        }
    }

    // Remove auto-generated warning comment from the accessible settings.
    values.erase(SETTINGS_WARN_MSG_KEY);

    return errors.empty();
}